

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O3

string * __thiscall
cmFilePathChecksum::getPart
          (string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath,size_t length)

{
  string local_38;
  
  get(&local_38,this,filePath);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFilePathChecksum::getPart(const std::string& filePath,
                                        size_t length) const
{
  return get(filePath).substr(0, length);
}